

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_read_file_to_buffer
               (char *filename,uint64_t maxsize,int require_text,uint64_t *user_result_size,
               char **user_result_buf)

{
  uint64_t uVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong n;
  ulong uVar7;
  ulong n_00;
  size_t __n;
  mcpl_buffer_t res;
  mcpl_generic_filehandle_t file;
  char *local_80;
  mcpl_buffer_t local_70;
  uint64_t *local_58;
  char **local_50;
  mcpl_generic_filehandle_t local_48;
  
  uVar7 = -(ulong)(maxsize == 0) | maxsize;
  local_58 = user_result_size;
  local_50 = user_result_buf;
  mcpl_generic_fopen(&local_48,filename);
  n = 0x10000;
  if (uVar7 < 0x10000) {
    n = uVar7;
  }
  local_70.size = 0;
  local_80 = mcpl_internal_malloc(n);
  __n = 0;
  local_70.buf = local_80;
  local_70.capacity = n;
  while( true ) {
    uVar6 = n - __n;
    if (uVar6 < 0x7fffffff) {
      n_00 = n * 2;
      if (uVar7 <= n * 2) {
        n_00 = uVar7;
      }
      if (n < n_00) {
        pcVar4 = mcpl_internal_malloc(n_00);
        memcpy(pcVar4,local_80,__n);
        free(local_80);
        uVar6 = n_00 - __n;
        n = n_00;
        local_80 = pcVar4;
      }
    }
    if (0x7ffffffe < uVar6) {
      uVar6 = 0x7fffffff;
    }
    uVar3 = mcpl_generic_fread_try(&local_48,local_80 + __n,(uint)uVar6);
    uVar1 = uVar3 + __n;
    if ((uVar3 < (uint)uVar6) || (uVar1 == uVar7)) break;
    __n = uVar1;
    if (0x100 < (uint)(n >> 0x20)) goto code_r0x00106b34;
  }
  local_70.buf = local_80;
  local_70.size = uVar1;
  local_70.capacity = n;
  mcpl_generic_fclose(&local_48);
  if (require_text == 0) goto LAB_00106bc3;
  if (uVar1 == 0) goto LAB_00106bb9;
  lVar5 = 0;
  while( true ) {
    cVar2 = local_80[lVar5];
    if ((4 < (byte)(cVar2 - 9U)) && (-1 < cVar2 && 0x5e < (byte)(cVar2 - 0x20U))) break;
    lVar5 = lVar5 + 1;
    if (__n + uVar3 == lVar5) {
LAB_00106bb9:
      mcpl_internal_normalise_eol(&local_70);
LAB_00106bc3:
      mcpl_internal_buf_squeeze(&local_70);
      *local_58 = local_70.size;
      *local_50 = local_70.buf;
      return;
    }
  }
  pcVar4 = "File is not a text file";
LAB_00106b3b:
  (*mcpl_error_handler)(pcVar4);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
code_r0x00106b34:
  pcVar4 = "mcpl_read_file_to_buffer trying to load more than 1TB";
  goto LAB_00106b3b;
}

Assistant:

void mcpl_read_file_to_buffer( const char * filename,
                               uint64_t maxsize,
                               int require_text,
                               uint64_t* user_result_size,
                               char ** user_result_buf )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint64_t) );

  if ( maxsize == 0 )
    maxsize = UINT64_MAX;

  mcpl_generic_filehandle_t file = mcpl_generic_fopen( filename );
  mcpl_buffer_t out = mcpl_internal_buf_create( 65536 > maxsize
                                                ? maxsize
                                                : 65536 );

  const unsigned max_at_a_time = INT32_MAX;

  while (1) {
    if ( out.capacity >= 1103806595072 )
      mcpl_error("mcpl_read_file_to_buffer trying to load more than 1TB");
    if ( out.capacity - out.size < max_at_a_time )
      mcpl_internal_buf_reserve( &out, ( out.capacity * 2 > (size_t)maxsize
                                         ? (size_t)maxsize
                                         : out.capacity*2) );
    size_t nread_max = out.capacity - out.size;
    unsigned max_in_this_go = ( nread_max > max_at_a_time
                                ? max_at_a_time
                                : (unsigned)nread_max );
    unsigned nread_actual = mcpl_generic_fread_try( &file,
                                                    out.buf + out.size,
                                                    max_in_this_go );
    out.size += nread_actual;
    if ( nread_actual < max_in_this_go || out.size == maxsize )
      break;//no more to read
  }

  mcpl_generic_fclose( &file );

  if ( require_text ) {
    if ( !mcpl_buf_is_text(&out) )
      mcpl_error("File is not a text file");
    mcpl_internal_normalise_eol(&out);
  }

  //Discard excess allocations:
  mcpl_internal_buf_squeeze( &out );

  //Done:
  *user_result_size = out.size;
  *user_result_buf = out.buf;
}